

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpc.c
# Opt level: O0

int mpc_input_string(mpc_input_t *i,char *c,char **o)

{
  int iVar1;
  size_t sVar2;
  char *pcVar3;
  char *local_30;
  char *x;
  char **o_local;
  char *c_local;
  mpc_input_t *i_local;
  
  mpc_input_mark(i);
  local_30 = c;
  while( true ) {
    if (*local_30 == '\0') {
      mpc_input_unmark(i);
      sVar2 = strlen(c);
      pcVar3 = (char *)mpc_malloc(i,sVar2 + 1);
      *o = pcVar3;
      strcpy(*o,c);
      return 1;
    }
    iVar1 = mpc_input_char(i,*local_30,(char **)0x0);
    if (iVar1 == 0) break;
    local_30 = local_30 + 1;
  }
  mpc_input_rewind(i);
  return 0;
}

Assistant:

static int mpc_input_string(mpc_input_t *i, const char *c, char **o) {

  const char *x = c;

  mpc_input_mark(i);
  while (*x) {
    if (!mpc_input_char(i, *x, NULL)) {
      mpc_input_rewind(i);
      return 0;
    }
    x++;
  }
  mpc_input_unmark(i);

  *o = mpc_malloc(i, strlen(c) + 1);
  strcpy(*o, c);
  return 1;
}